

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::insertFreeXrefEntry(QPDF *this,QPDFObjGen og)

{
  pointer pMVar1;
  size_type sVar2;
  int local_1c;
  QPDF *local_18;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  local_18 = this;
  this_local = (QPDF *)og;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  sVar2 = std::
          map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::count(&pMVar1->xref_table,(key_type *)&this_local);
  if (sVar2 == 0) {
    pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    local_1c = QPDFObjGen::getObj((QPDFObjGen *)&this_local);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert(&pMVar1->deleted_objects,&local_1c);
  }
  return;
}

Assistant:

void
QPDF::insertFreeXrefEntry(QPDFObjGen og)
{
    if (!m->xref_table.count(og)) {
        m->deleted_objects.insert(og.getObj());
    }
}